

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base32Encoding.cpp
# Opt level: O0

size_t axl::enc::Base32Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  ulong uVar1;
  C *pCVar2;
  uint in_ECX;
  long in_RDX;
  size_t in_RSI;
  uchar_t *in_RDI;
  char *dst;
  size_t lineCount;
  size_t length;
  size_t bitCount;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  size_t in_stack_fffffffffffffff8;
  
  if (in_RDX == 0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_stack_ffffffffffffffc0);
    local_38 = 0;
  }
  else {
    local_38 = (ulong)(in_RDX << 3) / 5;
    if ((ulong)(in_RDX << 3) % 5 != 0) {
      local_38 = local_38 + 1;
    }
    if ((in_ECX & 1) == 0) {
      local_38 = (7 - (local_38 - 1 & 7)) + local_38;
    }
    if ((in_ECX & 2) != 0) {
      uVar1 = local_38 >> 6;
      if ((uVar1 & 0x3f) != 0) {
        uVar1 = uVar1 + 1;
      }
      local_38 = (uVar1 - 1) + local_38;
    }
    pCVar2 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                       (string,(size_t)p,size._7_1_);
    if (pCVar2 == (C *)0x0) {
      local_38 = 0xffffffffffffffff;
    }
    else if ((in_ECX & 2) == 0) {
      encodeImpl<axl::enc::GetBase32Char,axl::enc::InsertNoNl>
                (dst,in_stack_fffffffffffffff8,in_RDI,in_RSI);
    }
    else {
      encodeImpl<axl::enc::GetBase32Char,axl::enc::InsertNl>
                (dst,in_stack_fffffffffffffff8,in_RDI,in_RSI);
    }
  }
  return local_38;
}

Assistant:

size_t
Base32Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 5;
	if (bitCount % 5)
		length++;

	if (!(flags & Base32EncodingFlag_NoPadding))
		length += 7 - ((length - 1) & 7);

	if (flags & Base32EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base32EncodingFlag_Multiline)
		encodeImpl<GetBase32Char, InsertNl>(dst, length, (uchar_t*)p, size);
	else
		encodeImpl<GetBase32Char, InsertNoNl>(dst, length, (uchar_t*)p, size);

	return length;
}